

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valence_cache.h
# Opt level: O2

void __thiscall
draco::ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate
          (ValenceCache<draco::CornerTable> *this)

{
  _Vector_base<signed_char,_std::allocator<signed_char>_> local_18;
  
  local_18._M_impl.super__Vector_impl_data._M_start =
       (this->vertex_valence_cache_8_bit_).vector_.
       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_18._M_impl.super__Vector_impl_data._M_finish =
       (this->vertex_valence_cache_8_bit_).vector_.
       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (local_18._M_impl.super__Vector_impl_data._M_finish !=
      local_18._M_impl.super__Vector_impl_data._M_start) {
    (this->vertex_valence_cache_8_bit_).vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_18._M_impl.super__Vector_impl_data._M_start;
    local_18._M_impl.super__Vector_impl_data._M_finish =
         local_18._M_impl.super__Vector_impl_data._M_start;
  }
  local_18._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->vertex_valence_cache_8_bit_).vector_.
       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  (this->vertex_valence_cache_8_bit_).vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertex_valence_cache_8_bit_).vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertex_valence_cache_8_bit_).vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base(&local_18);
  return;
}

Assistant:

void ClearValenceCacheInaccurate() const {
    vertex_valence_cache_8_bit_.clear();
    // Force erasure.
    IndexTypeVector<VertexIndex, int8_t>().swap(vertex_valence_cache_8_bit_);
  }